

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_CompileDefaultsMissingExtension_Test::TestBody
          (FeatureResolverTest_CompileDefaultsMissingExtension_Test *this)

{
  Descriptor *this_00;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *gmock_p0;
  HasErrorMatcherP<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher;
  char *message;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  Edition in_stack_ffffffffffffff38;
  AssertionResult gtest_ar;
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b0;
  undefined1 local_90 [8];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_88 [8];
  HasErrorMatcherP<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  _anonymous_namespace_ local_28 [32];
  
  testing::HasSubstr<char[18]>
            ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,(StringLike<char[18]> *)"Unknown extension");
  protobuf::(anonymous_namespace)::
  HasError<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_48,local_28,gmock_p0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
            (&local_b0,(internal *)&local_48,matcher);
  this_00 = FeatureSet::GetDescriptor();
  local_90[0] = '\0';
  local_90._1_3_ = 0;
  local_90._4_2_ = 0;
  local_90._6_2_ = 0;
  extensions.len_ = 1000;
  extensions.ptr_ = (pointer)0x1;
  FeatureResolver::CompileDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_88[0].status_,
             (FeatureResolver *)this_00,(Descriptor *)local_90,extensions,EDITION_2023,
             in_stack_ffffffffffffff38);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
  ::operator()(&gtest_ar,(char *)&local_b0,
               (StatusOr<google::protobuf::FeatureSetDefaults> *)
               "FeatureResolver::CompileDefaults(FeatureSet::descriptor(), {nullptr}, EDITION_2023, EDITION_2023)"
              );
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_88[0].status_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88[0].status_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x1a5,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_b0,(Message *)&local_88[0].status_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_88[0] !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x0) {
      (**(code **)(*(long *)local_88[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FeatureResolverTest, CompileDefaultsMissingExtension) {
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(), {nullptr},
                                       EDITION_2023, EDITION_2023),
      HasError(HasSubstr("Unknown extension")));
}